

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O0

char_class charclass(uchar c)

{
  int iVar1;
  undefined4 local_c;
  uchar c_local;
  
  iVar1 = Curl_isupper((uint)c);
  if (iVar1 == 0) {
    iVar1 = Curl_islower((uint)c);
    if (iVar1 == 0) {
      iVar1 = Curl_isdigit((uint)c);
      if (iVar1 == 0) {
        local_c = CCLASS_OTHER;
      }
      else {
        local_c = CCLASS_DIGIT;
      }
    }
    else {
      local_c = CCLASS_LOWER;
    }
  }
  else {
    local_c = CCLASS_UPPER;
  }
  return local_c;
}

Assistant:

static char_class charclass(unsigned char c)
{
  if(ISUPPER(c))
    return CCLASS_UPPER;
  if(ISLOWER(c))
    return CCLASS_LOWER;
  if(ISDIGIT(c))
    return CCLASS_DIGIT;
  return CCLASS_OTHER;
}